

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlidna.cpp
# Opt level: O2

QString * qt_ACE_do(QString *__return_storage_ptr__,QString *domain,AceOperation op,
                   AceLeadingDot dot,AceProcessingOptions options)

{
  QChar c;
  char32_t cVar1;
  bool bVar2;
  bool bVar3;
  char32_t ucs4;
  IdnaStatus IVar4;
  QString *pQVar5;
  Data *pDVar6;
  Data *pDVar7;
  qsizetype qVar8;
  byte *pbVar9;
  Char *pCVar10;
  long lVar11;
  byte bVar12;
  storage_type_conflict *psVar13;
  undefined1 *from;
  int iVar14;
  char16_t *pcVar15;
  int iVar16;
  QString *__range1;
  int iVar17;
  long lVar18;
  ulong uVar19;
  Data *len;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QStringView QVar20;
  QStringView label;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_98;
  DomainValidityChecker local_7b;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar6 = (Data *)(domain->d).size;
  if (pDVar6 == (Data *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_00246a15;
  }
  local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pDVar7 = (Data *)(domain->d).ptr;
  uVar19 = 0;
  for (lVar18 = (long)pDVar6 * 2; lVar18 != 0; lVar18 = lVar18 + -2) {
    c.ucs = *(char16_t *)
             ((long)&(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             uVar19 * 2);
    if ((0x7f < (ushort)c.ucs) ||
       (bVar2 = isValidInNormalizedAsciiLabel<QChar>(c), c.ucs != L'.' && !bVar2))
    goto LAB_00245fab;
    uVar19 = uVar19 + 1;
  }
  uVar19 = (ulong)pDVar6 & 0xffffffff;
LAB_00245fab:
  len = (Data *)(uVar19 & 0xffffffff);
  if (pDVar6 == len) {
    local_b8.d = (domain->d).d;
    local_b8.ptr = (char16_t *)pDVar7;
    local_b8.size = (qsizetype)pDVar6;
    if (local_b8.d != (Data *)0x0) {
      LOCK();
      ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
LAB_002461ae:
    local_d8.d = local_b8.d;
    local_d8.ptr = local_b8.ptr;
    local_d8.size = local_b8.size;
    if (local_b8.d != (Data *)0x0) {
      LOCK();
      ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      bVar2 = true;
      goto LAB_002461f8;
    }
    if ((Data *)local_b8.size != (Data *)0x0) goto LAB_00246208;
  }
  else {
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (char16_t *)0x0;
    local_b8.size = 0;
    QString::reserve((QString *)&local_b8,(qsizetype)pDVar6);
    pcVar15 = (domain->d).ptr;
    if ((QChar *)pcVar15 == (QChar *)0x0) {
      pcVar15 = L"";
    }
    QString::append((QString *)&local_b8,(QChar *)pcVar15,(qsizetype)len);
    local_78.d = (Data *)((domain->d).ptr + (long)len);
    local_78.size = (long)local_78.d + ((domain->d).size - (long)len) * 2;
    bVar2 = true;
    local_78.ptr = (char16_t *)local_78.d;
    while (local_78.ptr < (ulong)local_78.size) {
      ucs4 = QStringIterator::next((QStringIterator *)&local_78,L'�');
      if ((uint)ucs4 < 0x80) {
        cVar1 = ucs4 | 0x20;
        if (0x19 < (uint)(ucs4 + L'\xffffffbf')) {
          cVar1 = ucs4;
        }
        if ((((cVar1 != L'-') && (cVar1 != L'_')) && (9 < (uint)(cVar1 + L'\xffffffd0'))) &&
           (ucs4 = cVar1, cVar1 != L'.' && 0x19 < (uint)(cVar1 + L'\xffffff9f'))) {
LAB_002460db:
          IVar4 = QUnicodeTables::idnaStatus(ucs4);
          pQVar5 = (QString *)
                   (*(code *)(&DAT_00468e04 + *(int *)(&DAT_00468e04 + (ulong)IVar4 * 4)))();
          return pQVar5;
        }
        QString::append((QString *)&local_b8,(QChar)(char16_t)cVar1);
      }
      else {
        if (ucs4 != L'ẞ' ||
            ((uint)options.super_QFlagsStorageHelper<QUrl::AceProcessingOption,_4>.
                   super_QFlagsStorage<QUrl::AceProcessingOption>.i & 2) == 0) goto LAB_002460db;
        Qt::Literals::StringLiterals::operator____s((QString *)&local_58,L"ss",2);
        QString::append((QString *)&local_b8,(QString *)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        bVar2 = false;
      }
    }
    local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    if (bVar2) goto LAB_002461ae;
    bVar2 = false;
    QString::normalized((QString *)&local_d8,(QString *)&local_b8,NormalizationForm_C,
                        Unicode_Unassigned);
LAB_002461f8:
    if ((Data *)local_d8.size != (Data *)0x0) {
      if (!bVar2) {
        local_58.d = (Data *)CONCAT53(local_58.d._3_5_,0x10000);
        from = (undefined1 *)0x0;
        do {
          pDVar6 = (Data *)QString::indexOf((QString *)&local_d8,(QChar)0x2e,(qsizetype)from,
                                            CaseSensitive);
          if (pDVar6 == (Data *)0xffffffffffffffff) {
            pDVar6 = (Data *)local_d8.size;
          }
          if ((long)pDVar6 - (long)from != 0) {
            local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QString::QString((QString *)&local_78,
                             (QChar *)((long)&(((QArrayData *)local_d8.ptr)->ref_)._q_value.
                                              super___atomic_base<int>._M_i + (long)from * 2),
                             (long)pDVar6 - (long)from);
            bVar2 = anon_unknown.dwarf_4c6347::DomainValidityChecker::checkLabel
                              ((DomainValidityChecker *)&local_58,(QString *)&local_78,options);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
            if (!bVar2) goto LAB_00246408;
          }
          from = (undefined1 *)
                 ((long)&(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1)
          ;
        } while (pDVar6 != (Data *)local_d8.size);
        local_f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_f8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d = (Data *)local_d8.size;
        local_98.ptr = local_d8.ptr;
        local_78.d = (Data *)0x0;
        local_78.ptr = (char16_t *)0x0;
        local_78.size = 0;
        local_58.size = 0;
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        pDVar6 = (Data *)0x0;
        do {
          pDVar7 = (Data *)QStringView::indexOf
                                     ((QStringView *)&local_98,(QChar)0x2e,(qsizetype)pDVar6,
                                      CaseSensitive);
          pcVar15 = local_98.ptr;
          if (pDVar7 == (Data *)0xffffffffffffffff) {
            pDVar7 = local_98.d;
          }
          if ((long)pDVar7 - (long)pDVar6 == 0) {
            if (pDVar6 == local_98.d) {
LAB_0024642d:
              local_f8.size = local_58.size;
              local_f8.ptr = local_58.ptr;
              local_f8.d = local_58.d;
              local_58.d = (Data *)0x0;
              local_58.ptr = (char16_t *)0x0;
              local_58.size = 0;
              goto LAB_0024645b;
            }
            if ((dot == ForbidLeadingDot) || (0 < (long)pDVar6)) goto LAB_0024641d;
          }
          else {
            QString::clear((QString *)&local_78);
            QVar20.m_data =
                 (char16_t *)
                 ((long)&(((QArrayData *)pcVar15)->ref_)._q_value.super___atomic_base<int>._M_i +
                 (long)pDVar6 * 2);
            QVar20.m_size = (long)pDVar7 - (long)pDVar6;
            qt_punycodeEncoder(QVar20,(QString *)&local_78);
            if ((Data *)local_78.size == (Data *)0x0) goto LAB_0024641d;
            QString::append((QString *)&local_58,(QString *)&local_78);
            if (pDVar7 == local_98.d) goto LAB_0024642d;
          }
          QString::append((QString *)&local_58,(QChar)0x2e);
          pDVar6 = (Data *)((long)&(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>
                                   ._M_i + 1);
        } while( true );
      }
LAB_00246208:
      local_f8.d = local_d8.d;
      local_f8.ptr = local_d8.ptr;
      local_f8.size = local_d8.size;
      if (local_d8.d != (Data *)0x0) {
        LOCK();
        ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_0024647a;
    }
  }
LAB_00246408:
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  goto LAB_002468ce;
LAB_0024641d:
  local_f8.d = (Data *)0x0;
  local_f8.ptr = (char16_t *)0x0;
  local_f8.size = 0;
LAB_0024645b:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
LAB_0024647a:
  if ((Data *)local_f8.size == (Data *)0x0) {
LAB_00246550:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    local_78.ptr = local_f8.ptr;
    pDVar6 = (Data *)0x0;
    local_78.d = (Data *)local_f8.size;
    bVar2 = false;
    while ((long)pDVar6 < (long)local_78.d) {
      pDVar7 = (Data *)QStringView::indexOf
                                 ((QStringView *)&local_78,(QChar)0x2e,(qsizetype)pDVar6,
                                  CaseSensitive);
      if (pDVar7 == (Data *)0xffffffffffffffff) {
        pDVar7 = local_78.d;
      }
      label.m_size = (Data *)((long)pDVar7 - (long)pDVar6);
      if (label.m_size == (Data *)0x0) {
        if (pDVar6 == local_78.d) break;
        if ((dot == ForbidLeadingDot) || (bVar3 = bVar2, 0 < (long)pDVar6)) goto LAB_00246550;
      }
      else {
        local_58.ptr = (char16_t *)
                       ((long)&(((QArrayData *)local_78.ptr)->ref_)._q_value.
                               super___atomic_base<int>._M_i + (long)pDVar6 * 2);
        label.m_data = local_58.ptr;
        local_58.d = label.m_size;
        bVar3 = validateAsciiLabel(label);
        if (!bVar3) goto LAB_00246550;
        bVar3 = true;
        if (bVar2 == false) {
          s.m_data = "xn--";
          s.m_size = 4;
          bVar3 = QStringView::startsWith((QStringView *)&local_58,s,CaseSensitive);
        }
      }
      bVar2 = bVar3;
      pDVar6 = (Data *)((long)&(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                               _M_i + 1);
    }
    if ((op != ToAceOnly) && (bVar2 != false)) {
      if (((uint)options.super_QFlagsStorageHelper<QUrl::AceProcessingOption,_4>.
                 super_QFlagsStorage<QUrl::AceProcessingOption>.i & 1) != 0) goto LAB_002465ee;
      local_78.d = (Data *)local_f8.size;
      local_78.ptr = local_f8.ptr;
      qVar8 = QStringView::lastIndexOf((QStringView *)&local_78,(QChar)0x2e,CaseSensitive);
      if (qVar8 != -1) {
        QVar20 = QStringView::mid((QStringView *)&local_78,qVar8 + 1,-1);
        psVar13 = QVar20.m_data;
        if (user_idn_whitelist == (QStringList *)0x0) {
          lVar18 = (long)(int)QVar20.m_size * 2;
          iVar17 = 0x3d;
          iVar14 = 0x3c;
          iVar16 = 0;
          while (iVar17 = iVar17 / 2, iVar14 != iVar16) {
            pbVar9 = (byte *)QOffsetStringArray<std::array<char,_364UL>,_std::array<unsigned_short,_62UL>_>
                             ::at(&idn_whitelist,iVar17);
            if ((pbVar9 != (byte *)0x0) && (bVar12 = *pbVar9, bVar12 != 0)) {
              lVar11 = 0;
              while( true ) {
                pbVar9 = pbVar9 + 1;
                if ((bVar12 == 0) || (lVar18 == lVar11)) break;
                if (*(ushort *)((long)psVar13 + lVar11) != (ushort)bVar12) goto LAB_0024684f;
                bVar12 = *pbVar9;
                lVar11 = lVar11 + 2;
              }
              if (lVar18 == lVar11) {
                if (bVar12 != 0) goto LAB_00246856;
              }
              else {
LAB_0024684f:
                if (*(ushort *)((long)psVar13 + lVar11) < (ushort)bVar12) {
LAB_00246856:
                  iVar14 = iVar17 + -1;
                  iVar17 = iVar16;
                }
              }
            }
            iVar16 = iVar17;
            iVar17 = iVar16 + 1 + iVar14;
          }
          pCVar10 = QOffsetStringArray<std::array<char,_364UL>,_std::array<unsigned_short,_62UL>_>::
                    at(&idn_whitelist,iVar17);
          for (lVar18 = 0; (int)QVar20.m_size != (int)lVar18; lVar18 = lVar18 + 1) {
            if ((psVar13[lVar18] == L'\0') || (psVar13[lVar18] != (ushort)(byte)pCVar10[lVar18]))
            goto LAB_0024689d;
          }
LAB_002465ee:
          local_78.d = (Data *)0x0;
          local_78.ptr = (char16_t *)0x0;
          local_78.size = 0;
          QString::reserve((QString *)&local_78,local_f8.size);
          local_7b.domainNameIsBidi = false;
          local_7b.hadBidiErrors = false;
          local_7b.ignoreBidiErrors = false;
          pDVar6 = (Data *)0x0;
          do {
            pDVar7 = (Data *)QString::indexOf((QString *)&local_f8,(QChar)0x2e,(qsizetype)pDVar6,
                                              CaseSensitive);
            if (pDVar7 == (Data *)0xffffffffffffffff) {
              pDVar7 = (Data *)local_f8.size;
            }
            if ((long)pDVar7 - (long)pDVar6 == 0) {
              if (pDVar6 == (Data *)local_f8.size) goto LAB_00246764;
            }
            else {
              local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              QString::QString((QString *)&local_58,
                               (QChar *)((long)&(((QArrayData *)local_f8.ptr)->ref_)._q_value.
                                                super___atomic_base<int>._M_i + (long)pDVar6 * 2),
                               (long)pDVar7 - (long)pDVar6);
              local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              qt_punycodeDecoder((QString *)&local_98,(QString *)&local_58);
              if (((undefined1 *)local_98.size == (undefined1 *)0x0) ||
                 (bVar2 = anon_unknown.dwarf_4c6347::DomainValidityChecker::checkLabel
                                    (&local_7b,(QString *)&local_98,options), !bVar2)) {
                (__return_storage_ptr__->d).d = local_f8.d;
                (__return_storage_ptr__->d).ptr = local_f8.ptr;
                (__return_storage_ptr__->d).size = local_f8.size;
                if (local_f8.d != (Data *)0x0) {
                  LOCK();
                  ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                       + 1;
                  UNLOCK();
                }
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
                goto LAB_002467d7;
              }
              QString::append((QString *)&local_78,(QString *)&local_98);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
            }
            if (pDVar7 == (Data *)local_f8.size) goto LAB_00246764;
            QString::append((QString *)&local_78,(QChar)0x2e);
            pDVar6 = (Data *)((long)&(pDVar7->super_QArrayData).ref_._q_value.
                                     super___atomic_base<int>._M_i + 1);
          } while( true );
        }
        bVar2 = QListSpecialMethods<QString>::contains
                          ((QListSpecialMethods<QString> *)user_idn_whitelist,QVar20,CaseSensitive);
        if (bVar2) goto LAB_002465ee;
      }
    }
LAB_0024689d:
    (__return_storage_ptr__->d).d = local_f8.d;
    (__return_storage_ptr__->d).ptr = local_f8.ptr;
    (__return_storage_ptr__->d).size = local_f8.size;
    if (local_f8.d != (Data *)0x0) {
      LOCK();
      ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  goto LAB_002468c4;
LAB_00246764:
  qVar8 = local_78.size;
  pcVar15 = local_78.ptr;
  pDVar6 = local_78.d;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = pDVar6;
  (__return_storage_ptr__->d).ptr = pcVar15;
  local_78.size = 0;
  (__return_storage_ptr__->d).size = qVar8;
LAB_002467d7:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
LAB_002468c4:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
LAB_002468ce:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00246a15:
  __stack_chk_fail();
}

Assistant:

QString qt_ACE_do(const QString &domain, AceOperation op, AceLeadingDot dot,
                  QUrl::AceProcessingOptions options)
{
    if (domain.isEmpty())
        return {};

    bool mappedToAscii;
    const QString mapped = mapDomainName(domain, options, &mappedToAscii);
    const QString normalized =
            mappedToAscii ? mapped : mapped.normalized(QString::NormalizationForm_C);

    if (normalized.isEmpty())
        return {};

    if (!mappedToAscii && !checkUnicodeName(normalized, options))
        return {};

    bool needsConversionToUnicode;
    const QString aceResult = mappedToAscii ? normalized : convertToAscii(normalized, dot);
    if (aceResult.isEmpty() || !checkAsciiDomainName(aceResult, dot, &needsConversionToUnicode))
        return {};

    if (op == ToAceOnly || !needsConversionToUnicode
        || (!options.testFlag(QUrl::IgnoreIDNWhitelist) && !qt_is_idn_enabled(aceResult))) {
        return aceResult;
    }

    return convertToUnicode(aceResult, options);
}